

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O1

void va_block_arg_builtin(void *res,void *p,size_t s,uint64_t ncase)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  undefined8 local_28;
  undefined8 local_20;
  
  if (ncase - 3 < 2) {
    uVar1 = *(uint *)((long)p + 4);
    if ((ulong)uVar1 < 0xa1) {
      uVar2 = *p;
      if ((ulong)uVar2 < 0x29) {
        lVar3 = *(long *)((long)p + 0x10);
        if (ncase == 3) {
          local_28 = *(undefined8 *)(lVar3 + (ulong)uVar2);
          uVar5 = uVar1;
        }
        else {
          local_28 = *(undefined8 *)(lVar3 + (ulong)uVar1);
          uVar5 = uVar2;
        }
        local_20 = *(undefined8 *)(lVar3 + (ulong)uVar5);
        *(uint *)((long)p + 4) = uVar1 + 8;
        *(uint *)p = uVar2 + 8;
        goto LAB_0013efd3;
      }
    }
  }
  else {
    uVar4 = s + 7 & 0xfffffffffffffff8;
    if (ncase == 2) {
      uVar1 = *(uint *)((long)p + 4);
      local_28 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar1);
      *(uint *)((long)p + 4) = uVar1 + 0x10;
      if (8 < uVar4) {
        local_20 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)(uVar1 + 0x10));
        *(uint *)((long)p + 4) = uVar1 + 0x20;
      }
LAB_0013efd3:
      if (res == (void *)0x0) {
        return;
      }
      memcpy(res,&local_28,s);
      return;
    }
    if (ncase == 1) {
      uVar1 = *p;
      if (uVar4 + uVar1 < 0x31) {
        local_28 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar1);
        *(uint *)p = uVar1 + 8;
        if (8 < uVar4) {
          local_20 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)(uVar1 + 8));
          *(uint *)p = uVar1 + 0x10;
        }
        goto LAB_0013efd3;
      }
    }
  }
  if (res != (void *)0x0) {
    memcpy(res,*(void **)((long)p + 8),s);
  }
  *(long *)((long)p + 8) = *(long *)((long)p + 8) + (s + 7 & 0xfffffffffffffff8);
  return;
}

Assistant:

void va_block_arg_builtin (void *res, void *p, size_t s, uint64_t ncase) {
  struct x86_64_va_list *va = p;
  size_t size = ((s + 7) / 8) * 8;
  void *a = va->overflow_arg_area;
  union {
    uint64_t i;
    double d;
  } u[2];

  switch (ncase) {
  case 1:
    if (va->gp_offset + size > 48) break;
    u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    va->gp_offset += 8;
    if (size > 8) {
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      va->gp_offset += 8;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 2:
    u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    va->fp_offset += 16;
    if (size > 8) {
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      va->fp_offset += 16;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 3:
  case 4:
    if (va->fp_offset > 160 || va->gp_offset > 40) break;
    if (ncase == 3) {
      u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    } else {
      u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    }
    va->fp_offset += 8;
    va->gp_offset += 8;
    if (res != NULL) memcpy (res, &u, s);
    return;
  default: break;
  }
  if (res != NULL) memcpy (res, a, s);
  va->overflow_arg_area += size / 8;
}